

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

StringView __thiscall Corrade::Utility::JsonToken::data(JsonToken *this)

{
  char *data;
  ulong uVar1;
  StringViewFlags local_28;
  JsonToken *local_20;
  JsonToken *this_local;
  
  data = this->_data;
  uVar1 = this->_sizeFlagsParsedTypeType;
  local_20 = this;
  Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
            (&local_28);
  Containers::BasicStringView<const_char>::BasicStringView
            ((BasicStringView<const_char> *)&this_local,data,uVar1 & 0x7fffffffffffff,local_28);
  return _this_local;
}

Assistant:

Containers::StringView JsonToken::data() const {
    /* This could technically be made to preserve the Global flag, but on 32bit
       it would mean it'd have to be stored in two places -- either in the NaN
       bit pattern for object/array/string/literal and unparsed numeric tokens
       or in the upper bits of size for parsed numeric tokens (as the whole 64
       bits may be used by the stored number). But not just that, the flag
       would also have to be transferred from the NaN pattern to the size when
       parsing the numeric value for the first time, and *not* transferred from
       there if the numeric value is already parsed (since the bit there would
       likely mean for something else). And that's just too much logic and
       testing effort for something with a doubtful usefulness (compared to
       preserving the flag for asString()), so it's not done. */
    #ifndef CORRADE_TARGET_32BIT
    return {_data, _sizeFlagsParsedTypeType & SizeMask};
    #else
    /* If NaN is set and sign is 0, the full size is used */
    if((_childCountFlagsTypeNan & (NanMask|SignMask)) == NanMask)
        return {_data, _sizeParsedType};
    /* Otherwise it's likely small and the top is repurposed */
    return {_data, _sizeParsedType & SizeMask};
    #endif
}